

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O3

StringBuilder * __thiscall
nv::StringBuilder::appendFormat(StringBuilder *this,char *format,__va_list_tag *arg)

{
  va_list tmp;
  StringBuilder local_38;
  __va_list_tag local_28;
  
  local_28.reg_save_area = arg->reg_save_area;
  local_28.gp_offset = arg->gp_offset;
  local_28.fp_offset = arg->fp_offset;
  local_28.overflow_arg_area = arg->overflow_arg_area;
  local_38.m_size = 0;
  local_38.m_str = (char *)0x0;
  StringBuilder::format(&local_38,format,&local_28);
  append(this,local_38.m_str);
  local_38.m_size = 0;
  mem::free(local_38.m_str);
  return this;
}

Assistant:

StringBuilder & StringBuilder::appendFormat( const char * format, va_list arg )
{
	nvDebugCheck( format != NULL );
	
	va_list tmp;
	va_copy(tmp, arg);

	StringBuilder tmp_str;
	tmp_str.format( format, tmp );
	append( tmp_str );
	
	va_end(tmp);

	return *this;
}